

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O3

int linenoiseHistorySave(char *filename)

{
  __mode_t __mask;
  int iVar1;
  long lVar2;
  File file;
  allocator<char> local_51;
  File local_50;
  long *local_40 [2];
  long local_30 [2];
  
  __mask = umask(0x7f);
  local_50.file = (FILE *)0x0;
  local_50.fd = -1;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,filename,&local_51);
  local_50.file = (FILE *)fopen((char *)local_40[0],"w");
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  umask(__mask);
  if ((FILE *)local_50.file == (FILE *)0x0) {
    iVar1 = -1;
  }
  else {
    chmod(filename,0x180);
    if (history_len < 1) {
      iVar1 = 0;
    }
    else {
      iVar1 = 0;
      lVar2 = 0;
      do {
        fprintf((FILE *)local_50.file,"%s\n",history[lVar2]);
        lVar2 = lVar2 + 1;
      } while (lVar2 < history_len);
    }
  }
  File::~File(&local_50);
  return iVar1;
}

Assistant:

int linenoiseHistorySave(const char *filename) {
    mode_t old_umask = umask(S_IXUSR|S_IRWXG|S_IRWXO);
    File   file;
    file.open(filename, "w");
    umask(old_umask);
    if (file.file == NULL) {
        return -1;
    }
    chmod(filename,S_IRUSR|S_IWUSR);
    for (int j = 0; j < history_len; ++j) {
        fprintf(file.file, "%s\n", history[j]);
    }

    return 0;
}